

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.cpp
# Opt level: O3

void __thiscall
chrono::ChLoadCustomMultiple::LoadIntLoadResidual_Mv
          (ChLoadCustomMultiple *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  ChLoadJacobians *pCVar3;
  double *pdVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  pointer psVar9;
  ulong uVar10;
  int i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  ChVectorDynamic<> grouped_w;
  ChVectorDynamic<> grouped_cMv;
  uint local_b8;
  assign_op<double,_double> local_b1;
  ChLoadCustomMultiple *local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  ulong local_90;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_88;
  double local_78;
  ChVectorDynamic<> *local_70;
  Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
  local_68;
  
  if ((this->super_ChLoadBase).jacobians != (ChLoadJacobians *)0x0) {
    local_78 = c;
    iVar5 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])();
    local_a8.m_storage.m_data = (double *)0x0;
    local_a8.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_a8,(long)iVar5);
    iVar5 = (*(this->super_ChLoadBase).super_ChObj._vptr_ChObj[7])(this);
    local_88.m_storage.m_data = (double *)0x0;
    local_88.m_storage.m_rows = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_88,(long)iVar5);
    psVar9 = (this->loadables).
             super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_b0 = this;
    if ((this->loadables).
        super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
      uVar12 = 0;
      local_b8 = 0;
      local_70 = R;
      do {
        uVar11 = 0;
        local_90 = uVar12;
        while( true ) {
          iVar5 = (*(psVar9[uVar12].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ChLoadable[8])();
          if (iVar5 <= (int)uVar11) break;
          peVar2 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (*peVar2->_vptr_ChLoadable[0xb])(peVar2,uVar11);
          if ((char)iVar5 != '\0') {
            peVar2 = (this->loadables).
                     super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar5 = (*peVar2->_vptr_ChLoadable[9])(peVar2,uVar11);
            uVar13 = 0;
            while( true ) {
              peVar2 = (local_b0->loadables).
                       super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              uVar6 = (*peVar2->_vptr_ChLoadable[10])(peVar2,uVar11);
              if (uVar6 <= uVar13) break;
              uVar8 = (ulong)(uint)(iVar5 + (int)uVar13);
              if ((w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_rows <= (long)uVar8) {
                __assert_fail("index >= 0 && index < size()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                              "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                             );
              }
              uVar10 = local_b8 + uVar13 & 0xffffffff;
              if (local_a8.m_storage.m_rows <= (long)uVar10) {
LAB_005c6a7e:
                __assert_fail("index >= 0 && index < size()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                             );
              }
              uVar13 = uVar13 + 1;
              local_a8.m_storage.m_data[uVar10] =
                   (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[uVar8];
            }
            local_b8 = local_b8 + (int)uVar13;
            this = local_b0;
            R = local_70;
          }
          psVar9 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (ulong)((int)uVar11 + 1);
        }
        psVar9 = (this->loadables).
                 super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = local_90 + 1;
      } while (uVar12 < (ulong)((long)(this->loadables).
                                      super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4
                               ));
    }
    pCVar3 = (this->super_ChLoadBase).jacobians;
    local_68.m_lhs.m_lhs.m_cols.m_value =
         (pCVar3->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_cols;
    local_68.m_lhs.m_lhs.m_rows.m_value =
         (pCVar3->M).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
         m_rows;
    if ((local_68.m_lhs.m_lhs.m_cols.m_value | local_68.m_lhs.m_lhs.m_rows.m_value) < 0) {
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
                   );
    }
    local_68.m_lhs.m_rhs = &pCVar3->M;
    local_68.m_rhs = (RhsNested)&local_a8;
    local_68.m_lhs.m_lhs.m_functor.m_other = local_78;
    if (local_68.m_lhs.m_lhs.m_cols.m_value != local_a8.m_storage.m_rows) {
      __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                    ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                    "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
                   );
    }
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>,Eigen::internal::assign_op<double,double>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_88,&local_68,&local_b1,(type)0x0);
    psVar9 = (this->loadables).
             super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->loadables).
        super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar9) {
      uVar12 = 0;
      uVar6 = 0;
      do {
        uVar11 = 0;
        local_90 = uVar12;
        while( true ) {
          iVar5 = (*(psVar9[uVar12].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_ChLoadable[8])();
          if (iVar5 <= (int)uVar11) break;
          peVar2 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar12].
                   super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          iVar5 = (*peVar2->_vptr_ChLoadable[0xb])(peVar2,uVar11);
          if ((char)iVar5 != '\0') {
            peVar2 = (this->loadables).
                     super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar12].
                     super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar5 = (*peVar2->_vptr_ChLoadable[9])(peVar2,uVar11);
            uVar13 = 0;
            while( true ) {
              peVar2 = (local_b0->loadables).
                       super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar12].
                       super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              uVar7 = (*peVar2->_vptr_ChLoadable[10])(peVar2,uVar11);
              if (uVar7 <= uVar13) break;
              uVar8 = uVar6 + uVar13 & 0xffffffff;
              if ((local_88.m_storage.m_rows <= (long)uVar8) ||
                 (uVar10 = (ulong)(uint)(iVar5 + (int)uVar13),
                 (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows <= (long)uVar10)) goto LAB_005c6a7e;
              auVar15._8_8_ = 0;
              auVar15._0_8_ = local_78;
              uVar13 = uVar13 + 1;
              auVar14._8_8_ = 0;
              auVar14._0_8_ = local_88.m_storage.m_data[uVar8];
              pdVar4 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                       .m_data;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = pdVar4[uVar10];
              auVar1 = vfmadd213sd_fma(auVar14,auVar15,auVar1);
              pdVar4[uVar10] = auVar1._0_8_;
            }
            uVar6 = uVar6 + (int)uVar13;
            this = local_b0;
          }
          psVar9 = (this->loadables).
                   super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar11 = (ulong)((int)uVar11 + 1);
        }
        psVar9 = (this->loadables).
                 super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar12 = local_90 + 1;
      } while (uVar12 < (ulong)((long)(this->loadables).
                                      super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar9 >> 4
                               ));
    }
    if (local_88.m_storage.m_data != (double *)0x0) {
      free((void *)local_88.m_storage.m_data[-1]);
    }
    if (local_a8.m_storage.m_data != (double *)0x0) {
      free((void *)local_a8.m_storage.m_data[-1]);
    }
  }
  return;
}

Assistant:

void ChLoadCustomMultiple::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, const double c) {
    if (!this->jacobians)
        return;
    // fetch w as a contiguous vector
    ChVectorDynamic<> grouped_w(this->LoadGet_ndof_w());
    ChVectorDynamic<> grouped_cMv(this->LoadGet_ndof_w());
    unsigned int rowQ = 0;
    for (int k = 0; k < loadables.size(); ++k) {
        for (int i = 0; i < loadables[k]->GetSubBlocks(); ++i) {
            if (loadables[k]->IsSubBlockActive(i)) {
                unsigned int moffset = loadables[k]->GetSubBlockOffset(i);
                for (unsigned int row = 0; row < loadables[k]->GetSubBlockSize(i); ++row) {
                    grouped_w(rowQ) = w(row + moffset);
                    ++rowQ;
                }
            }
        }
    }
    // do computation R=c*M*v
    grouped_cMv = c * this->jacobians->M * grouped_w;
    rowQ = 0;
    for (int k = 0; k < loadables.size(); ++k) {
        for (int i = 0; i < loadables[k]->GetSubBlocks(); ++i) {
            if (loadables[k]->IsSubBlockActive(i)) {
                unsigned int moffset = loadables[k]->GetSubBlockOffset(i);
                for (unsigned int row = 0; row < loadables[k]->GetSubBlockSize(i); ++row) {
                    R(row + moffset) += grouped_cMv(rowQ) * c;
                    ++rowQ;
                }
            }
        }
    }
}